

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::debugReportRowPrice
          (HighsSparseMatrix *this,HighsInt iRow,double multiplier,HighsInt to_iEl,
          HighsSparseVectorSum *sum)

{
  value_type vVar1;
  const_reference pvVar2;
  uint *puVar3;
  int in_EDX;
  uint in_ESI;
  double in_RDI;
  double in_XMM0_Qa;
  HighsInt iCol;
  HighsInt iEl;
  HighsInt num_print;
  HighsInt in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint index;
  int iVar4;
  
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x10),(long)(int)in_ESI);
  if ((*pvVar2 < in_EDX) && ((in_XMM0_Qa != 0.0 || (NAN(in_XMM0_Qa))))) {
    printf("Row %d: value = %11.4g",in_XMM0_Qa,(ulong)in_ESI);
    iVar4 = 0;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x10),(long)(int)in_ESI
                       );
    for (vVar1 = *pvVar2; vVar1 < in_EDX; vVar1 = vVar1 + 1) {
      puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x40),
                                  (long)vVar1);
      index = *puVar3;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0x58),(long)vVar1);
      HighsSparseVectorSum::add((HighsSparseVectorSum *)CONCAT44(iVar4,vVar1),index,in_RDI);
      if (iVar4 % 5 == 0) {
        printf("\n");
      }
      HighsSparseVectorSum::getValue
                ((HighsSparseVectorSum *)CONCAT44(index,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
      printf("[%4d %11.4g] ",(ulong)index);
      iVar4 = iVar4 + 1;
    }
    printf("\n");
  }
  return;
}

Assistant:

void HighsSparseMatrix::debugReportRowPrice(const HighsInt iRow,
                                            const double multiplier,
                                            const HighsInt to_iEl,
                                            HighsSparseVectorSum& sum) const {
  if (this->start_[iRow] >= to_iEl) return;
  if (!multiplier) return;
  printf("Row %d: value = %11.4g", (int)iRow, multiplier);
  HighsInt num_print = 0;
  for (HighsInt iEl = this->start_[iRow]; iEl < to_iEl; iEl++) {
    HighsInt iCol = this->index_[iEl];
    sum.add(iCol, multiplier * this->value_[iEl]);
    if (num_print % 5 == 0) printf("\n");
    printf("[%4d %11.4g] ", (int)(iCol), sum.getValue(iCol));
    num_print++;
  }
  printf("\n");
}